

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_Leader::GetBBox
          (ON_OBSOLETE_V5_Leader *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  ON_2dPoint *pOVar2;
  ON_3dPoint local_c0;
  double dStack_98;
  ON_2dPoint uv;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  ON_3dPointArray P;
  undefined1 auStack_58 [4];
  int point_count;
  ON_BoundingBox bbox;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_OBSOLETE_V5_Leader *this_local;
  
  bbox.m_max.z._7_1_ = bGrowBox;
  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)auStack_58);
  if ((bbox.m_max.z._7_1_ & 1) != 0) {
    _auStack_58 = *boxmin;
    bbox.m_min.x = boxmin[1];
    bbox.m_min.y = boxmin[2];
    bbox.m_min.z = *boxmax;
    bbox.m_max.x = boxmax[1];
    bbox.m_max.y = boxmax[2];
    bVar1 = ON_BoundingBox::IsValid((ON_BoundingBox *)auStack_58);
    if (!bVar1) {
      ON_BoundingBox::Destroy((ON_BoundingBox *)auStack_58);
      bbox.m_max.z._7_1_ = 0;
    }
  }
  P.super_ON_SimpleArray<ON_3dPoint>.m_capacity =
       ON_SimpleArray<ON_2dPoint>::Count
                 (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>
                 );
  if (0 < P.super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
    ON_3dPointArray::ON_3dPointArray
              ((ON_3dPointArray *)local_78,P.super_ON_SimpleArray<ON_3dPoint>.m_capacity);
    for (local_7c = 0; local_7c < P.super_ON_SimpleArray<ON_3dPoint>.m_capacity;
        local_7c = local_7c + 1) {
      pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,local_7c);
      dStack_98 = pOVar2->x;
      uv.x = pOVar2->y;
      ON_Plane::PointAt(&local_c0,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,dStack_98,uv.x);
      ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_78,&local_c0);
    }
    bVar1 = ON_3dPointArray::GetBoundingBox
                      ((ON_3dPointArray *)local_78,(ON_BoundingBox *)auStack_58,
                       bbox.m_max.z._7_1_ & 1);
    if (bVar1) {
      bbox.m_max.z._7_1_ = 1;
    }
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_78);
  }
  if ((bbox.m_max.z._7_1_ & 1) != 0) {
    *boxmin = _auStack_58;
    boxmin[1] = bbox.m_min.x;
    boxmin[2] = bbox.m_min.y;
    *boxmax = bbox.m_min.z;
    boxmax[1] = bbox.m_max.x;
    boxmax[2] = bbox.m_max.y;
  }
  return (bool)(bbox.m_max.z._7_1_ & 1);
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetBBox(
        double* boxmin,
        double* boxmax,
        bool bGrowBox
        ) const
{
  ON_BoundingBox bbox;
  if ( bGrowBox )
  {
    bbox.m_min.x = boxmin[0]; 
    bbox.m_min.y = boxmin[1]; 
    bbox.m_min.z = boxmin[2];
    bbox.m_max.x = boxmax[0]; 
    bbox.m_max.y = boxmax[1]; 
    bbox.m_max.z = boxmax[2];
    if ( !bbox.IsValid() )
    {
      bbox.Destroy();
      bGrowBox = false;
    }
  }

  const int point_count = m_points.Count();
  if ( point_count > 0 )
  {
    ON_3dPointArray P(point_count);
    int i;
    for ( i = 0; i < point_count; i++ )
    {
      ON_2dPoint uv = m_points[i];
      P.Append( m_plane.PointAt(uv.x,uv.y));
    }
    if ( P.GetBoundingBox(bbox,bGrowBox?true:false) )
      bGrowBox = true;
  }

  if ( bGrowBox )
  {
    boxmin[0] = bbox.m_min.x; 
    boxmin[1] = bbox.m_min.y; 
    boxmin[2] = bbox.m_min.z; 
    boxmax[0] = bbox.m_max.x; 
    boxmax[1] = bbox.m_max.y; 
    boxmax[2] = bbox.m_max.z; 
  }

  return bGrowBox;
}